

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFunctions.cpp
# Opt level: O0

BasicValue *
cvm::Unix::Fork(BasicValue *__return_storage_ptr__,
               list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_1)

{
  __pid_t I;
  list<cvm::BasicValue,_std::allocator<cvm::BasicValue>_> *param_0_local;
  
  I = fork();
  BasicValue::BasicValue(__return_storage_ptr__,I);
  return __return_storage_ptr__;
}

Assistant:

BasicValue Unix::Fork(std::list<BasicValue> &/*Args*/) {
  return ::fork();
}